

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

opStatus __thiscall
llvm::APFloat::fusedMultiplyAdd(APFloat *this,APFloat *Multiplicand,APFloat *Addend,roundingMode RM)

{
  bool bVar1;
  fltSemantics *pfVar2;
  fltSemantics *pfVar3;
  roundingMode RM_local;
  APFloat *Addend_local;
  APFloat *Multiplicand_local;
  APFloat *this_local;
  
  pfVar2 = getSemantics(this);
  pfVar3 = getSemantics(Multiplicand);
  if (pfVar2 != pfVar3) {
    __assert_fail("&getSemantics() == &Multiplicand.getSemantics() && \"Should only call on APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x3e6,
                  "opStatus llvm::APFloat::fusedMultiplyAdd(const APFloat &, const APFloat &, roundingMode)"
                 );
  }
  pfVar2 = getSemantics(this);
  pfVar3 = getSemantics(Addend);
  if (pfVar2 != pfVar3) {
    __assert_fail("&getSemantics() == &Addend.getSemantics() && \"Should only call on APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,1000,
                  "opStatus llvm::APFloat::fusedMultiplyAdd(const APFloat &, const APFloat &, roundingMode)"
                 );
  }
  pfVar2 = getSemantics(this);
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfVar2);
  if (bVar1) {
    this_local._4_4_ =
         detail::IEEEFloat::fusedMultiplyAdd
                   (&(this->U).IEEE,&(Multiplicand->U).IEEE,&(Addend->U).IEEE,RM);
  }
  else {
    pfVar2 = getSemantics(this);
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(pfVar2);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,0x3ee);
    }
    this_local._4_4_ =
         detail::DoubleAPFloat::fusedMultiplyAdd
                   ((DoubleAPFloat *)&(this->U).IEEE,(DoubleAPFloat *)&(Multiplicand->U).IEEE,
                    (DoubleAPFloat *)&(Addend->U).IEEE,RM);
  }
  return this_local._4_4_;
}

Assistant:

opStatus fusedMultiplyAdd(const APFloat &Multiplicand, const APFloat &Addend,
                            roundingMode RM) {
    assert(&getSemantics() == &Multiplicand.getSemantics() &&
           "Should only call on APFloats with the same semantics");
    assert(&getSemantics() == &Addend.getSemantics() &&
           "Should only call on APFloats with the same semantics");
    if (usesLayout<IEEEFloat>(getSemantics()))
      return U.IEEE.fusedMultiplyAdd(Multiplicand.U.IEEE, Addend.U.IEEE, RM);
    if (usesLayout<DoubleAPFloat>(getSemantics()))
      return U.Double.fusedMultiplyAdd(Multiplicand.U.Double, Addend.U.Double,
                                       RM);
    llvm_unreachable("Unexpected semantics");
  }